

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall
AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
          (AutoTagNativeLibraryEntry *this,RecyclableObject *function,CallInfo callInfo,PCWSTR name,
          void *addr)

{
  ScriptContext *this_00;
  ThreadContext *this_01;
  ThreadContext *threadContext;
  void *addr_local;
  PCWSTR name_local;
  RecyclableObject *function_local;
  AutoTagNativeLibraryEntry *this_local;
  CallInfo callInfo_local;
  
  NativeLibraryEntryRecord::Entry::Entry(&this->entry);
  (this->entry).function = function;
  (this->entry).callInfo = callInfo;
  (this->entry).name = name;
  (this->entry).addr = addr;
  this_00 = Js::RecyclableObject::GetScriptContext(function);
  this_01 = Js::ScriptContext::GetThreadContext(this_00);
  ThreadContext::PushNativeLibraryEntry(this_01,&this->entry);
  return;
}

Assistant:

AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry(Js::RecyclableObject* function, Js::CallInfo callInfo, PCWSTR name, void* addr)
{
    // Save function/callInfo values (for StackWalker). Compiler may stackpack/optimize them for built-in native functions.
    entry.function = function;
    entry.callInfo = callInfo;
    entry.name = name;
    entry.addr = addr;

    ThreadContext* threadContext = function->GetScriptContext()->GetThreadContext();
    threadContext->PushNativeLibraryEntry(&entry);
}